

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::update(Forth *this)

{
  bool bVar1;
  reference ppVar2;
  _Self local_28;
  _Self local_20;
  iterator foundIt;
  Cell u;
  Forth *this_local;
  
  foundIt._M_node._4_4_ = this->blockCurrent;
  if (foundIt._M_node._4_4_ != 0) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::find(&this->blocksInProcess,(key_type *)((long)&foundIt._M_node + 4));
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::end(&this->blocksInProcess);
    bVar1 = std::operator==(&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::
               operator*(&local_20);
      (ppVar2->second).blockModified = true;
    }
  }
  return;
}

Assistant:

void update(){
			Cell u = blockCurrent;
			if (u > 0) {
				auto foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					(*foundIt).second.blockModified = true;
				}
			}
		}